

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdD3D56TlvColor::emulate_mthd(MthdD3D56TlvColor *this)

{
  uint32_t *puVar1;
  byte bVar2;
  
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tlv_color =
       (this->super_SingleMthdTest).super_MthdTest.val;
  puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid + 1;
  *(byte *)puVar1 = (byte)*puVar1 | 2;
  if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x48) {
    bVar2 = (byte)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                  d3d56_tlv_fog_tri_col1 & 0xf;
  }
  else {
    bVar2 = (byte)*(undefined4 *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
  }
  puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid;
  *puVar1 = *puVar1 & ~(uint)(1L << (bVar2 & 0x3f));
  return;
}

Assistant:

void emulate_mthd() override {
		exp.d3d56_tlv_color = val;
		insrt(exp.valid[1], 1, 1, 1);
		int vidx = (cls == 0x48 ? extr(exp.d3d56_tlv_fog_tri_col1, 0, 4) : idx);
		insrt(exp.valid[0], vidx, 1, 0);
	}